

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRExpression * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::
allocate<std::__cxx11::string_const&,unsigned_int&,bool>
          (ObjectPool<spirv_cross::SPIRExpression> *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p,uint *p_1,bool *p_2)

{
  Vector<spirv_cross::SPIRExpression_*> *this_00;
  SPIRExpression *pSVar1;
  size_t sVar2;
  ulong count;
  bool bVar3;
  SPIRExpression *ptr;
  SPIRExpression *local_60;
  SPIRExpression *local_58;
  string local_50;
  
  this_00 = &this->vacants;
  sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
  if (sVar2 == 0) {
    count = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRExpression,_spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar1 = (SPIRExpression *)malloc(count * 0xf0);
    if (pSVar1 == (SPIRExpression *)0x0) {
      return (SPIRExpression *)0x0;
    }
    local_58 = pSVar1;
    SmallVector<spirv_cross::SPIRExpression_*,_0UL>::reserve(this_00,count);
    while (bVar3 = count != 0, count = count - 1, bVar3) {
      local_60 = pSVar1;
      SmallVector<spirv_cross::SPIRExpression_*,_0UL>::push_back(this_00,&local_60);
      pSVar1 = pSVar1 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRExpression,spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRExpression*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRExpression,spirv_cross::ObjectPool<spirv_cross::SPIRExpression>::MallocDeleter>,8ul>
                *)&this->memory,&local_58);
    sVar2 = (this->vacants).super_VectorView<spirv_cross::SPIRExpression_*>.buffer_size;
  }
  pSVar1 = (this_00->super_VectorView<spirv_cross::SPIRExpression_*>).ptr[sVar2 - 1];
  SmallVector<spirv_cross::SPIRExpression_*,_0UL>::pop_back(this_00);
  ::std::__cxx11::string::string((string *)&local_50,(string *)p);
  SPIRExpression::SPIRExpression(pSVar1,&local_50,(TypeID)*p_1,*p_2);
  ::std::__cxx11::string::~string((string *)&local_50);
  return pSVar1;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			vacants.reserve(num_objects);
			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}